

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  __normal_iterator<testing::TestEventListener_*const_*,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
  *p_Var1;
  reference ppTVar2;
  iterator __position;
  value_type in_RSI;
  __normal_iterator<testing::TestEventListener_**,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
  *in_RDI;
  size_t i;
  vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_> *this_00;
  __normal_iterator<testing::TestEventListener_*const_*,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
  *this_01;
  vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<testing::TestEventListener_*const_*,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
  *local_20;
  
  local_20 = (__normal_iterator<testing::TestEventListener_*const_*,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
              *)0x0;
  while( true ) {
    this_01 = local_20;
    p_Var1 = (__normal_iterator<testing::TestEventListener_*const_*,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
              *)std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::size((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                        *)(in_RDI + 2));
    if (p_Var1 <= this_01) {
      return (TestEventListener *)0x0;
    }
    ppTVar2 = std::
              vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::
              operator[]((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                          *)(in_RDI + 2),(size_type)local_20);
    if (*ppTVar2 == in_RSI) break;
    local_20 = (__normal_iterator<testing::TestEventListener_*const_*,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
                *)((long)&local_20->_M_current + 1);
  }
  this_00 = (vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_> *)
            (in_RDI + 2);
  __position = std::
               vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::
               begin(this_00);
  __gnu_cxx::
  __normal_iterator<testing::TestEventListener_**,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
  ::operator+(in_RDI,(difference_type)this_01);
  __gnu_cxx::
  __normal_iterator<testing::TestEventListener*const*,std::vector<testing::TestEventListener*,std::allocator<testing::TestEventListener*>>>
  ::__normal_iterator<testing::TestEventListener**>
            (this_01,(__normal_iterator<testing::TestEventListener_**,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
                      *)this_00);
  std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::erase
            (in_stack_ffffffffffffffc0,(const_iterator)__position._M_current);
  return in_RSI;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener* listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + static_cast<int>(i));
      return listener;
    }
  }

  return nullptr;
}